

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void lexer_init(FILE *infile)

{
  option_t *poVar1;
  
  f = infile;
  poVar1 = get_option("-ftabstop=");
  tabstop = (poVar1->value).num;
  readbyte();
  if (l == 0xef) {
    readbyte();
    if ((l == 0xbb) && (readbyte(), l == 0xbf)) {
      readbyte();
      line = 1;
      column = 0;
      c = 10;
      return;
    }
    fseek((FILE *)f,1,0);
    l = 0xef;
  }
  line = 1;
  column = 0;
  c = 10;
  return;
}

Assistant:

void lexer_init(FILE* infile)
{
    f = infile;
    tabstop = get_option("-ftabstop=")->value.num;

    readbyte();

    /* skip UTF-8 BOM */
    if (l == 0xEF)
    {
        readbyte();
        if (l == 0xBB)
        {
            readbyte();
            if (l == 0xBF)
                readbyte();
            else
            {
                fseek(f, 1, SEEK_SET);
                l = 0xEF;
            }
        }
        else
        {
            fseek(f, 1, SEEK_SET);
            l = 0xEF;
        }
    }

    line = 1;
    column = 0;
    c = '\n';
}